

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall RandomBotStrategy::sendRandomArmies(RandomBotStrategy *this)

{
  result_type_conflict rVar1;
  uniform_int_distribution<int> dis;
  param_type local_8;
  
  local_8 = (param_type)((ulong)(*((this->super_PlayerStrategy).from)->pNumberOfTroops - 1) << 0x20)
  ;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_8,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&stack0x00000008,&local_8);
  return rVar1;
}

Assistant:

int RandomBotStrategy::sendRandomArmies(std::mt19937 gen) {
    int maxArmies = this->from->getNumberOfTroops() - 1;
    std::uniform_int_distribution<> dis(0, maxArmies);
    return dis(gen);
}